

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  uint uVar1;
  Mutability MVar2;
  iterator this_00;
  bool bVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  pointer ppVar10;
  ulong uVar11;
  size_type sVar12;
  IString *this_01;
  mapped_type *pmVar13;
  mapped_type *this_02;
  value_type local_100;
  key_type local_fc;
  value_type newIndex_1;
  Index i_2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  oldFieldNames;
  TypeNames *nameInfo;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_b0;
  iterator iter;
  uint local_94;
  value_type newIndex;
  Index i_1;
  FieldList copy;
  Index removed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexesAfterRemoval;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_60;
  iterator remIter;
  uint local_44;
  Index i;
  vector<bool,_std::allocator<bool>_> *immutableVec;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  local_30;
  iterator immIter;
  FieldList *newFields;
  Struct *struct__local;
  TypeRewriter *this_local;
  HeapType oldStructType_local;
  
  immIter.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
               )struct_;
  this_local = (TypeRewriter *)oldStructType.id;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
       ::find((unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
               *)(*(long *)((long)this + 0x68) + 0x90),(key_type *)&this_local);
  immutableVec = (vector<bool,_std::allocator<bool>_> *)
                 std::
                 unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::end((unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                        *)(*(long *)((long)this + 0x68) + 0x90));
  bVar3 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                      *)&immutableVec);
  if (bVar3) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
                           *)&local_30);
    for (local_44 = 0; sVar6 = std::vector<bool,_std::allocator<bool>_>::size(&ppVar4->second),
        local_44 < sVar6; local_44 = local_44 + 1) {
      _remIter = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&ppVar4->second,(ulong)local_44);
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&remIter);
      if (bVar3) {
        pvVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            immIter.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur,(ulong)local_44);
        pvVar8->mutable_ = Immutable;
      }
    }
  }
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)(*(long *)((long)this + 0x68) + 200),(key_type *)&this_local);
  indexesAfterRemoval =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)(*(long *)((long)this + 0x68) + 200));
  bVar3 = std::__detail::operator!=
                    (&local_60,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                      *)&indexesAfterRemoval);
  if (bVar3) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                           *)&local_60);
    copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&newIndex,
               (vector<wasm::Field,_std::allocator<wasm::Field>_> *)
               immIter.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
               ._M_cur);
    for (local_94 = 0;
        sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                          ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                           immIter.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                           ._M_cur), this_00 = immIter, local_94 < sVar6; local_94 = local_94 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&ppVar5->second,(ulong)local_94);
      uVar1 = *pvVar7;
      if (uVar1 == 0xffffffff) {
        copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      else {
        pvVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&newIndex,
                            (ulong)local_94);
        pvVar9 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            immIter.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur,(ulong)uVar1);
        (pvVar9->type).id = (pvVar8->type).id;
        MVar2 = pvVar8->mutable_;
        pvVar9->packedType = pvVar8->packedType;
        pvVar9->mutable_ = MVar2;
      }
    }
    sVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                       immIter.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                       ._M_cur);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::resize
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
               this_00.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
               ._M_cur,sVar6 - copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::find((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                 *)(*(long *)((long)this + 8) + 400),(key_type *)&this_local);
    nameInfo = (TypeNames *)
               std::
               unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
               ::end((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                      *)(*(long *)((long)this + 8) + 400));
    bVar3 = std::__detail::operator!=
                      (&local_b0,
                       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        *)&nameInfo);
    if (bVar3) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
                operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                            *)&local_b0);
      oldFieldNames._M_h._M_single_bucket = (__node_base_ptr)&ppVar10->second;
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)&newIndex_1,&(ppVar10->second).fieldNames);
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::clear((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               *)(oldFieldNames._M_h._M_single_bucket + 2));
      for (local_fc = 0; uVar11 = (ulong)local_fc,
          sVar12 = std::
                   unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   ::size((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                           *)&newIndex_1), uVar11 < sVar12; local_fc = local_fc + 1) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&ppVar5->second,(ulong)local_fc);
        local_100 = *pvVar7;
        if ((local_100 != 0xffffffff) &&
           (sVar12 = std::
                     unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     ::count((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                              *)&newIndex_1,&local_fc), sVar12 != 0)) {
          this_01 = &std::
                     unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                   *)&newIndex_1,&local_fc)->super_IString;
          bVar3 = IString::is(this_01);
          if (!bVar3) {
            __assert_fail("oldFieldNames[i].is()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                          ,0x1b4,
                          "virtual void wasm::(anonymous namespace)::GlobalTypeOptimization::updateTypes(Module &)::TypeRewriter::modifyStruct(HeapType, Struct &)"
                         );
          }
          pmVar13 = std::
                    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                  *)&newIndex_1,&local_fc);
          this_02 = std::
                    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                  *)(oldFieldNames._M_h._M_single_bucket + 2),&local_100);
          wasm::Name::operator=(this_02,pmVar13);
        }
      }
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                        *)&newIndex_1);
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&newIndex);
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        auto& newFields = struct_.fields;

        // Adjust immutability.
        auto immIter = parent.canBecomeImmutable.find(oldStructType);
        if (immIter != parent.canBecomeImmutable.end()) {
          auto& immutableVec = immIter->second;
          for (Index i = 0; i < immutableVec.size(); i++) {
            if (immutableVec[i]) {
              newFields[i].mutable_ = Immutable;
            }
          }
        }

        // Remove/reorder fields where we can.
        auto remIter = parent.indexesAfterRemovals.find(oldStructType);
        if (remIter != parent.indexesAfterRemovals.end()) {
          auto& indexesAfterRemoval = remIter->second;
          Index removed = 0;
          auto copy = newFields;
          for (Index i = 0; i < newFields.size(); i++) {
            auto newIndex = indexesAfterRemoval[i];
            if (newIndex != RemovedField) {
              newFields[newIndex] = copy[i];
            } else {
              removed++;
            }
          }
          newFields.resize(newFields.size() - removed);

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones (it
          // just keeps the names in sequence).
          auto iter = wasm.typeNames.find(oldStructType);
          if (iter != wasm.typeNames.end()) {
            auto& nameInfo = iter->second;

            // Make a copy of the old ones to base ourselves off of as we do so.
            auto oldFieldNames = nameInfo.fieldNames;

            // Clear the old names and write the new ones.
            nameInfo.fieldNames.clear();
            for (Index i = 0; i < oldFieldNames.size(); i++) {
              auto newIndex = indexesAfterRemoval[i];
              if (newIndex != RemovedField && oldFieldNames.count(i)) {
                assert(oldFieldNames[i].is());
                nameInfo.fieldNames[newIndex] = oldFieldNames[i];
              }
            }
          }
        }
      }